

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auxil.c
# Opt level: O2

c_int adapt_rho(OSQPWorkspace *work)

{
  c_int *pcVar1;
  double dVar2;
  double dVar3;
  c_int cVar4;
  c_float rho_new;
  
  rho_new = compute_rho_estimate(work);
  work->info->rho_estimate = rho_new;
  dVar2 = work->settings->rho;
  dVar3 = work->settings->adaptive_rho_tolerance;
  if ((dVar2 * dVar3 < rho_new) || (rho_new < dVar2 / dVar3)) {
    cVar4 = osqp_update_rho(work,rho_new);
    pcVar1 = &work->info->rho_updates;
    *pcVar1 = *pcVar1 + 1;
  }
  else {
    cVar4 = 0;
  }
  return cVar4;
}

Assistant:

c_int adapt_rho(OSQPWorkspace *work) {
  c_int   exitflag; // Exitflag
  c_float rho_new;  // New rho value

  exitflag = 0;     // Initialize exitflag to 0

  // Compute new rho
  rho_new = compute_rho_estimate(work);

  // Set rho estimate in info
  work->info->rho_estimate = rho_new;

  // Check if the new rho is large or small enough and update it in case
  if ((rho_new > work->settings->rho * work->settings->adaptive_rho_tolerance) ||
      (rho_new < work->settings->rho /  work->settings->adaptive_rho_tolerance)) {
    exitflag                 = osqp_update_rho(work, rho_new);
    work->info->rho_updates += 1;
  }

  return exitflag;
}